

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cpp
# Opt level: O2

void __thiscall r_exec::_Mem::~_Mem(_Mem *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

_Mem::~_Mem()
{
    std::cout << "cores left:" << std::to_string(m_coreCount) << std::endl;
    for (const auto &o : objects) {
        std::cout << "refcount" << o.object->refCount << std::endl;
    }
    objects.clear();
    for (std::ostream *stream : debug_streams) {
        delete stream;
    }
}